

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgzip.c
# Opt level: O0

FT_Error ft_gzip_file_fill_output(FT_GZipFile zip)

{
  int iVar1;
  FT_Error local_1c;
  int err;
  FT_Error error;
  z_stream *zstream;
  FT_GZipFile zip_local;
  
  local_1c = 0;
  zip->cursor = zip->buffer;
  (zip->zstream).next_out = zip->cursor;
  (zip->zstream).avail_out = 0x1000;
  do {
    if ((zip->zstream).avail_out == 0) {
      return local_1c;
    }
    if (((zip->zstream).avail_in == 0) && (local_1c = ft_gzip_file_fill_input(zip), local_1c != 0))
    {
      return local_1c;
    }
    iVar1 = inflate(&zip->zstream,0);
    if (iVar1 == 1) {
      zip->limit = (zip->zstream).next_out;
      if (zip->limit != zip->cursor) {
        return local_1c;
      }
      return 0x55;
    }
  } while (iVar1 == 0);
  zip->limit = zip->cursor;
  return 0x55;
}

Assistant:

static FT_Error
  ft_gzip_file_fill_output( FT_GZipFile  zip )
  {
    z_stream*  zstream = &zip->zstream;
    FT_Error   error   = FT_Err_Ok;


    zip->cursor        = zip->buffer;
    zstream->next_out  = zip->cursor;
    zstream->avail_out = FT_GZIP_BUFFER_SIZE;

    while ( zstream->avail_out > 0 )
    {
      int  err;


      if ( zstream->avail_in == 0 )
      {
        error = ft_gzip_file_fill_input( zip );
        if ( error )
          break;
      }

      err = inflate( zstream, Z_NO_FLUSH );

      if ( err == Z_STREAM_END )
      {
        zip->limit = zstream->next_out;
        if ( zip->limit == zip->cursor )
          error = FT_THROW( Invalid_Stream_Operation );
        break;
      }
      else if ( err != Z_OK )
      {
        zip->limit = zip->cursor;
        error      = FT_THROW( Invalid_Stream_Operation );
        break;
      }
    }

    return error;
  }